

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O0

string * helics::core::to_string_abi_cxx11_(CoreType type)

{
  undefined4 in_ESI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  allocator<char> *in_stack_ffffffffffffff80;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff88;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25;
  allocator<char> local_24;
  allocator<char> local_23;
  allocator<char> local_22;
  allocator<char> local_21;
  undefined1 local_20 [2];
  allocator<char> local_1e;
  allocator<char> local_1d [16];
  allocator<char> local_d [13];
  
  switch(in_ESI) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_1e);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(local_d);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(local_1d);
    break;
  case 4:
  case 5:
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator((allocator<char> *)local_20);
    break;
  case 6:
    __s = &local_21;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,(char *)__s,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_21);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_24);
    break;
  default:
    std::__cxx11::string::string(in_stack_ffffffffffffff60);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_25);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator((allocator<char> *)(local_20 + 1));
    break;
  case 0xb:
    __a = &local_22;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,__a);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_23);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 0x12:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 0x42:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 0x4d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_29);
  }
  return in_RDI;
}

Assistant:

std::string to_string(CoreType type)
{
    switch (type) {
        case CoreType::MPI:
            return "mpi_";
        case CoreType::TEST:
            return "test_";
        case CoreType::ZMQ:
            return "zmq_";
        case CoreType::ZMQ_SS:
            return "zmqss_";
        case CoreType::INTERPROCESS:
        case CoreType::IPC:
            return "ipc_";
        case CoreType::TCP:
            return "tcp_";
        case CoreType::TCP_SS:
            return "tcpss_";
        case CoreType::HTTP:
            return "http_";
        case CoreType::UDP:
            return "udp_";
        case CoreType::NNG:
            return "nng_";
        case CoreType::INPROC:
            return "inproc_";
        case CoreType::WEBSOCKET:
            return "websocket_";
        case CoreType::NULLCORE:
            return "null_";
        case CoreType::EMPTY:
            return "empty_";
        default:
            return {};
    }
}